

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::ParenOp::tokenize(ParenOp *this,GeneratorState *state,TokenStream *str)

{
  Token local_30;
  
  local_30.m_type = LEFT_PAREN;
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  (*this->m_child->_vptr_Expression[3])(this->m_child,state,str);
  local_30.m_type = RIGHT_PAREN;
  TokenStream::operator<<(str,&local_30);
  Token::~Token(&local_30);
  return;
}

Assistant:

void ParenOp::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token::LEFT_PAREN;
	m_child->tokenize(state, str);
	str << Token::RIGHT_PAREN;
}